

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<short>_>::
UpdateWindowState<duckdb::ModeState<short,_duckdb::ModeStandard<short>_>,_short>::Left
          (UpdateWindowState<duckdb::ModeState<short,_duckdb::ModeStandard<short>_>,_short> *this,
          idx_t begin,idx_t end)

{
  bool bVar1;
  idx_t local_20;
  
  while (begin < end) {
    local_20 = begin;
    bVar1 = ModeIncluded<duckdb::ModeState<short,_duckdb::ModeStandard<short>_>_>::operator()
                      (this->included,&local_20);
    if (bVar1) {
      ModeState<short,_duckdb::ModeStandard<short>_>::ModeRm(this->state,local_20);
    }
    begin = local_20 + 1;
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeRm(begin);
				}
			}
		}